

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

bool __thiscall
libtorrent::dht::dht_tracker::send_packet
          (dht_tracker *this,listen_socket_handle *s,entry *e,endpoint *addr)

{
  bool bVar1;
  entry *this_00;
  _Base_ptr p_Var2;
  pointer pcVar3;
  int64_t value;
  int c;
  counters *this_01;
  long lVar4;
  string_view key;
  span<const_char> __args_2;
  error_code ec;
  string_type local_70;
  data_union local_4c;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70.field_2._M_allocated_capacity._0_4_ = 0x1002544c;
  local_70._M_string_length = 4;
  local_70.field_2._M_local_buf[4] = '\0';
  key._M_str = "v";
  key._M_len = 1;
  this_00 = entry::operator[](e,key);
  entry::operator=(this_00,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  pcVar3 = (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar3) {
    (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar3;
  }
  bencode<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
            ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_>)&this->m_send_buf,e);
  this->m_send_quota =
       this->m_send_quota +
       (*(int *)&(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start -
       *(int *)&(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish);
  ec._0_8_ = ec._5_8_ << 0x28;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  aux::listen_socket_handle::get_local_endpoint((endpoint *)&local_4c.base,s);
  if (((addr->impl_).data_.base.sa_family == 2) == (local_4c.base.sa_family != 2)) {
    for (p_Var2 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
      s = (listen_socket_handle *)(p_Var2 + 1);
      aux::listen_socket_handle::get_local_endpoint((endpoint *)&local_4c.base,s);
      if (((addr->impl_).data_.base.sa_family == 2) != (local_4c.base.sa_family != 2)) {
        pcVar3 = (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = (long)(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar3;
        goto LAB_00356049;
      }
    }
    ec = boost::asio::error::make_error_code(address_family_not_supported);
  }
  else {
    pcVar3 = (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pcVar3;
LAB_00356049:
    __args_2.m_len = lVar4;
    __args_2.m_ptr = pcVar3;
    ::std::
    function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
    ::operator()(&this->m_send_fun,s,addr,__args_2,&ec,
                 (bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)0x0);
  }
  bVar1 = ec.failed_;
  this_01 = this->m_counters;
  if (ec.failed_ == true) {
    c = 0x8c;
  }
  else {
    counters::inc_stats_counter
              (this_01,0x8e,
               (long)(*(int *)&(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
    value = 0x30;
    if ((addr->impl_).data_.base.sa_family == 2) {
      value = 0x1c;
    }
    counters::inc_stats_counter(this->m_counters,0x81,value);
    this_01 = this->m_counters;
    c = 0x8b;
  }
  counters::inc_stats_counter(this_01,c,1);
  pcVar3 = (this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (*(this->m_log->super_dht_logger)._vptr_dht_logger[2])
            (this->m_log,1,pcVar3,
             (long)(this->m_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar3,addr);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool dht_tracker::send_packet(aux::listen_socket_handle const& s, entry& e, udp::endpoint const& addr)
	{
		TORRENT_ASSERT(m_nodes.find(s) != m_nodes.end());

		static_assert(lt::version_minor < 16, "version number not supported by DHT");
		static_assert(lt::version_tiny < 16, "version number not supported by DHT");
		static char const ver[] = {'L', 'T'
			, lt::version_major, (lt::version_minor << 4) | lt::version_tiny};
		e["v"] = std::string(ver, ver+ 4);

		m_send_buf.clear();
		bencode(std::back_inserter(m_send_buf), e);

		// update the quota. We won't prevent the packet to be sent if we exceed
		// the quota, we'll just (potentially) block the next incoming request.

		m_send_quota -= int(m_send_buf.size());

		error_code ec;
		if (s.get_local_endpoint().protocol().family() != addr.protocol().family())
		{
			// the node is trying to send a packet to a different address family
			// than its socket, this can happen during bootstrap
			// pick a node with the right address family and use its socket
			auto n = std::find_if(m_nodes.begin(), m_nodes.end()
				, [&](tracker_nodes_t::value_type const& v)
					{ return v.first.get_local_endpoint().protocol().family() == addr.protocol().family(); });

			if (n != m_nodes.end())
				m_send_fun(n->first, addr, m_send_buf, ec, {});
			else
				ec = boost::asio::error::address_family_not_supported;
		}
		else
		{
			m_send_fun(s, addr, m_send_buf, ec, {});
		}

		if (ec)
		{
			m_counters.inc_stats_counter(counters::dht_messages_out_dropped);
#ifndef TORRENT_DISABLE_LOGGING
			m_log->log_packet(dht_logger::outgoing_message, m_send_buf, addr);
#endif
			return false;
		}

		m_counters.inc_stats_counter(counters::dht_bytes_out, int(m_send_buf.size()));
		// account for IP and UDP overhead
		m_counters.inc_stats_counter(counters::sent_ip_overhead_bytes
			, aux::is_v6(addr) ? 48 : 28);
		m_counters.inc_stats_counter(counters::dht_messages_out);
#ifndef TORRENT_DISABLE_LOGGING
		m_log->log_packet(dht_logger::outgoing_message, m_send_buf, addr);
#endif
		return true;
	}